

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void list_append_new(list_t *list,void *data)

{
  list_node_t *node;
  
  node = list_node_new();
  node->data = data;
  list_append(list,node);
  return;
}

Assistant:

void
list_append_new(
    list_t* list,
    void* data)
{
    list_node_t* node = list_node_new();
    node->data = data;
    list_append(list, node);
}